

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O3

void __thiscall FConfigFile::LoadConfigFile(FConfigFile *this)

{
  bool bVar1;
  FILE *__stream;
  
  __stream = fopen((this->PathName).Chars,"r");
  this->FileExisted = false;
  if (__stream != (FILE *)0x0) {
    bVar1 = ReadConfig(this,__stream);
    fclose(__stream);
    this->FileExisted = bVar1;
  }
  return;
}

Assistant:

void FConfigFile::LoadConfigFile ()
{
	FILE *file = fopen (PathName, "r");
	bool succ;

	FileExisted = false;
	if (file == NULL)
	{
		return;
	}

	succ = ReadConfig (file);
	fclose (file);
	FileExisted = succ;
}